

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::enableDISTANCEheuristic(Solver *this)

{
  Heap<Minisat::Solver::VarOrderLt> *this_00;
  
  if (this->current_heuristic == CHB) {
    this->current_heuristic = DISTANCE;
    this_00 = &this->order_heap_DISTANCE;
    Heap<Minisat::Solver::VarOrderLt>::growTo<Minisat::Solver::VarOrderLt>
              (this_00,&this->order_heap_CHB);
    Heap<Minisat::Solver::VarOrderLt>::build(this_00,&(this->order_heap_CHB).heap);
    this->order_heap = this_00;
  }
  else if (this->current_heuristic == VSIDS_CHB) {
    this->current_heuristic = VSIDS_DISTANCE;
  }
  return;
}

Assistant:

void Solver::enableDISTANCEheuristic()
{
    switch (current_heuristic) {
    case VSIDS_CHB:
        /* currently VSIDS, just change swap partner */
        current_heuristic = VSIDS_DISTANCE;
        break;
    case CHB:
        current_heuristic = DISTANCE;
        order_heap_DISTANCE.growTo(order_heap_CHB);
        order_heap_DISTANCE.build(order_heap_CHB.elements());
        order_heap = &order_heap_DISTANCE;
        break;
    default:
        break;
    }
    assert(considersDISTANCE() && "we should have enabled DISTANCE heuristic");
    assert((trail.size() + order_heap->size()) >= full_heap_size);
}